

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrs.h
# Opt level: O2

int Psr_NtkSigName(Psr_Ntk_t *p,int i)

{
  if ((p->field_0x4 & 2) != 0) {
    if (i < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x13e,"int Abc_Lit2Att2(int)");
    }
    if ((i & 3U) != 0) {
      __assert_fail("Abc_Lit2Att2(i) == BAC_PRS_NAME",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPrs.h"
                    ,0x77,"int Psr_NtkSigName(Psr_Ntk_t *, int)");
    }
    i = (uint)i >> 2;
  }
  return i;
}

Assistant:

static inline int         Psr_NtkSigName( Psr_Ntk_t * p, int i )       { if (!p->fSlices) return i; assert(Abc_Lit2Att2(i) == BAC_PRS_NAME); return Abc_Lit2Var2(i); }